

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O2

void big_record_type_set(BigRecordType *rtype,int i,char *name,char *dtype,int nmemb)

{
  size_t sVar1;
  BigRecordField *pBVar2;
  char *__dest;
  ulong uVar3;
  size_t l;
  size_t __n;
  
  uVar3 = (ulong)i;
  if (uVar3 < rtype->nfield) {
    free(rtype->fields[uVar3].name);
  }
  else {
    sVar1 = uVar3 + 1;
    pBVar2 = (BigRecordField *)realloc(rtype->fields,sVar1 * 0x20);
    rtype->fields = pBVar2;
    memset(pBVar2 + rtype->nfield,0,(sVar1 - rtype->nfield) * 0x20);
    rtype->nfield = sVar1;
  }
  for (__n = 0; (__n != 0x2000 && (name[__n] != '\0')); __n = __n + 1) {
  }
  __dest = (char *)malloc(__n + 1);
  strncpy(__dest,name,__n);
  __dest[__n] = '\0';
  pBVar2 = rtype->fields;
  pBVar2[uVar3].name = __dest;
  strncpy(pBVar2[uVar3].dtype,dtype,8);
  rtype->fields[uVar3].nmemb = nmemb;
  return;
}

Assistant:

void
big_record_type_set(BigRecordType * rtype,
    int i,
    const char * name,
    const char * dtype,
    int nmemb)
{
    if(i >= rtype->nfield) {
        rtype->fields = realloc(rtype->fields,
            (i + 1) * sizeof(rtype->fields[0]));
        memset(&rtype->fields[rtype->nfield], 0,
            (i + 1 - rtype->nfield) * sizeof(rtype->fields[0]));
        rtype->nfield = i + 1;
    } else {
        if(rtype->fields[i].name) {
            free(rtype->fields[i].name);
        }
    }
    rtype->fields[i].name = _strdup(name);
    strncpy(rtype->fields[i].dtype, dtype, 8);
    rtype->fields[i].nmemb = nmemb;
}